

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O0

sexp sexp_get_output_string_op(sexp ctx,sexp self,sexp_sint_t n,sexp out)

{
  undefined8 ctx_00;
  undefined8 in_RCX;
  long in_RDI;
  bool bVar1;
  sexp_gc_var_t __sexp_gc_preserver3;
  sexp tmp;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp rev;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp ls;
  sexp res;
  sexp in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  sexp in_stack_ffffffffffffff88;
  sexp obj;
  char *in_stack_ffffffffffffff90;
  sexp self_00;
  sexp psVar2;
  undefined8 in_stack_ffffffffffffffa0;
  undefined8 ctx_01;
  undefined8 uVar3;
  undefined8 sep;
  undefined8 str_ls;
  undefined8 local_8;
  
  memset(&stack0xffffffffffffffb8,0,0x10);
  memset(&stack0xffffffffffffffa0,0,0x10);
  psVar2 = (sexp)&DAT_0000043e;
  memset(&stack0xffffffffffffff88,0,0x10);
  if (((in_RCX & 3) == 0) && (((sexp)in_RCX)->tag == 0x11)) {
    if ((((sexp)in_RCX)->value).flonum_bits[0x28] == '\0') {
      local_8 = sexp_xtype_exception
                          ((sexp)in_stack_ffffffffffffffa0,psVar2,in_stack_ffffffffffffff90,
                           in_stack_ffffffffffffff88);
    }
    else if ((((((sexp)in_RCX)->value).string.offset & 3) == 0) &&
            (((((sexp)in_RCX)->value).type.cpl)->tag == 6)) {
      sep = &stack0xffffffffffffffc8;
      str_ls = *(undefined8 *)(in_RDI + 0x6080);
      *(undefined1 **)(in_RDI + 0x6080) = &stack0xffffffffffffffb8;
      ctx_01 = &stack0xffffffffffffffb0;
      uVar3 = *(undefined8 *)(in_RDI + 0x6080);
      *(undefined1 **)(in_RDI + 0x6080) = &stack0xffffffffffffffa0;
      obj = (sexp)&stack0xffffffffffffff98;
      self_00 = *(sexp *)(in_RDI + 0x6080);
      *(undefined1 **)(in_RDI + 0x6080) = &stack0xffffffffffffff88;
      if ((((sexp)in_RCX)->value).type.print == (sexp)0x0) {
        ctx_00 = (((((sexp)in_RCX)->value).type.cpl)->value).type.cpl;
      }
      else {
        psVar2 = sexp_c_string(psVar2,(char *)self_00,(sexp_sint_t)obj);
        ctx_00 = sexp_cons_op(psVar2,self_00,(sexp_sint_t)obj,
                              (sexp)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                              in_stack_ffffffffffffff78);
      }
      psVar2 = sexp_reverse_op((sexp)ctx_00,(sexp)uVar3,ctx_01,psVar2);
      local_8 = &DAT_0000003e;
      uVar3 = psVar2;
      while( true ) {
        bVar1 = false;
        if (((ulong)psVar2 & 3) == 0) {
          bVar1 = psVar2->tag == 6;
        }
        if (!bVar1) break;
        if ((((psVar2->value).stack.length & 3) != 0) || (((psVar2->value).type.name)->tag != 9)) {
          local_8 = sexp_xtype_exception((sexp)ctx_01,psVar2,(char *)self_00,obj);
        }
        psVar2 = (psVar2->value).type.cpl;
      }
      if (psVar2 != (sexp)&DAT_0000023e) {
        local_8 = sexp_xtype_exception((sexp)ctx_01,psVar2,(char *)self_00,obj);
      }
      if (((local_8 & 3) != 0) || (((sexp)local_8)->tag != 0x13)) {
        local_8 = sexp_string_concatenate_op
                            ((sexp)in_RCX,(sexp)local_8,uVar3,(sexp)str_ls,(sexp)sep);
      }
      *(undefined8 *)(in_RDI + 0x6080) = str_ls;
    }
    else {
      local_8 = sexp_xtype_exception
                          ((sexp)in_stack_ffffffffffffffa0,psVar2,in_stack_ffffffffffffff90,
                           in_stack_ffffffffffffff88);
    }
  }
  else {
    local_8 = sexp_type_exception((sexp)in_stack_ffffffffffffffa0,psVar2,
                                  (sexp_uint_t)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  return (sexp)local_8;
}

Assistant:

sexp sexp_get_output_string_op (sexp ctx, sexp self, sexp_sint_t n, sexp out) {
  sexp res;
  sexp_gc_var3(ls, rev, tmp);
  sexp_assert_type(ctx, sexp_oportp, SEXP_OPORT, out);
  if (!sexp_port_openp(out))
    return sexp_xtype_exception(ctx, self, "output port is closed", out);
  if (!sexp_pairp(sexp_port_cookie(out)))
    return sexp_xtype_exception(ctx, self, "not a string output port", out);
  sexp_gc_preserve3(ctx, ls, rev, tmp);
  if (sexp_port_offset(out) > 0) {
    tmp = sexp_c_string(ctx, sexp_port_buf(out), sexp_port_offset(out));
    rev = sexp_cons(ctx, tmp, sexp_cdr(sexp_port_cookie(out)));
  } else {
    rev = sexp_cdr(sexp_port_cookie(out));
  }
  ls = sexp_reverse(ctx, rev);
  res = SEXP_FALSE;
  for (tmp = ls; sexp_pairp(tmp); tmp = sexp_cdr(tmp))
    if (!sexp_stringp(sexp_car(tmp)))
      res = sexp_xtype_exception(ctx, self, "not an output string port", out);
  if (!sexp_nullp(tmp))
    res = sexp_xtype_exception(ctx, self, "not an output string port", out);
  if (!sexp_exceptionp(res))
    res = sexp_string_concatenate(ctx, ls, SEXP_FALSE);
  sexp_gc_release3(ctx);
  return res;
}